

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformtheme.cpp
# Opt level: O0

QVariant * QPlatformTheme::defaultThemeHint(ThemeHint hint)

{
  initializer_list<Qt::Key> args;
  ThemeHint hint_00;
  int iVar1;
  uint in_ESI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int dist_1;
  int dist;
  bool ok_1;
  bool ok;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QSize *pQVar2;
  QSize *local_f0;
  undefined1 local_e8 [54];
  bool local_b2;
  bool local_b1;
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [30];
  QChar local_32;
  undefined4 local_30;
  undefined4 local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch((iterator)(ulong)in_ESI) {
  case (iterator)0x0:
    ::QVariant::QVariant((QVariant *)in_RDI,1000);
    break;
  case (iterator)0x1:
    ::QVariant::QVariant((QVariant *)in_RDI,400);
    break;
  case (iterator)0x2:
    ::QVariant::QVariant((QVariant *)in_RDI,400);
    break;
  case (iterator)0x3:
    ::QVariant::QVariant((QVariant *)in_RDI,10);
    break;
  case (iterator)0x4:
    ::QVariant::QVariant((QVariant *)in_RDI,500);
    break;
  case (iterator)0x5:
    ::QVariant::QVariant((QVariant *)in_RDI,0x1e);
    break;
  case (iterator)0x6:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0x7:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0x8:
    ::QVariant::QVariant((QVariant *)in_RDI,1);
    break;
  case (iterator)0x9:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0xa:
    ::QVariant::QVariant((QVariant *)in_RDI,-1);
    break;
  case (iterator)0xb:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0xc:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0xd:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0xe:
  case (iterator)0xf:
    pQVar2 = in_RDI;
    QString::QString((QString *)0x3ef072);
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_50);
    QString::~QString((QString *)0x3ef091);
    in_RDI = pQVar2;
    break;
  case (iterator)0x10:
    pQVar2 = in_RDI;
    memset(local_68,0,0x18);
    QList<QString>::QList((QList<QString> *)0x3ef0b7);
    ::QVariant::QVariant((QVariant *)in_RDI,(QList_conflict3 *)local_68);
    QList<QString>::~QList((QList<QString> *)0x3ef0d6);
    in_RDI = pQVar2;
    break;
  case (iterator)0x11:
    pQVar2 = in_RDI;
    memset(local_98,0,0x18);
    QList<QString>::QList((QList<QString> *)0x3ef141);
    ::QVariant::QVariant((QVariant *)in_RDI,(QList_conflict3 *)local_98);
    QList<QString>::~QList((QList<QString> *)0x3ef160);
    in_RDI = pQVar2;
    break;
  case (iterator)0x12:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x13:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0x14:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x15:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x16:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0x17:
    ::QVariant::QVariant((QVariant *)in_RDI,0);
    break;
  case (iterator)0x18:
    ::QVariant::QVariant((QVariant *)in_RDI,6);
    break;
  case (iterator)0x19:
    ::QVariant::QVariant((QVariant *)in_RDI,0xff);
    break;
  case (iterator)0x1a:
    memset(local_b0,0,0x18);
    QList<int>::QList((QList<int> *)0x3ef21d);
    ::QVariant::fromValue<QList<int>,_true>((QList<int> *)in_RDI);
    QList<int>::~QList((QList<int> *)0x3ef23c);
    break;
  case (iterator)0x1b:
    pQVar2 = in_RDI;
    QChar::QChar<char16_t,_true>(&local_32,L'●');
    ::QVariant::QVariant((QVariant *)in_RDI,local_32);
    in_RDI = pQVar2;
    break;
  case (iterator)0x1c:
  case (iterator)0x1d:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x1e:
    ::QVariant::QVariant((QVariant *)in_RDI,800);
    break;
  case (iterator)0x1f:
    local_b1 = false;
    pQVar2 = in_RDI;
    iVar1 = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST",&local_b1);
    if ((local_b1 & 1U) == 0) {
      iVar1 = 5;
    }
    ::QVariant::QVariant((QVariant *)in_RDI,iVar1);
    in_RDI = pQVar2;
    break;
  case (iterator)0x20:
    ::QVariant::QVariant((QVariant *)in_RDI,3);
    break;
  case (iterator)0x21:
    local_b2 = false;
    pQVar2 = in_RDI;
    hint_00 = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST",&local_b2);
    if ((local_b2 & 1U) == 0) {
      defaultThemeHint(hint_00);
      iVar1 = ::QVariant::toInt((bool *)&local_28);
      hint_00 = iVar1 << 1;
      ::QVariant::~QVariant(&local_28);
    }
    if ((local_b2 & 1U) == 0) {
      hint_00 = MaximumScrollBarDragDistance;
    }
    ::QVariant::QVariant((QVariant *)in_RDI,hint_00);
    in_RDI = pQVar2;
    break;
  case (iterator)0x22:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (iterator)0x23:
    pQVar2 = in_RDI;
    memset(local_80,0,0x18);
    QList<QString>::QList((QList<QString> *)0x3ef0fc);
    ::QVariant::QVariant((QVariant *)in_RDI,(QList_conflict3 *)local_80);
    QList<QString>::~QList((QList<QString> *)0x3ef11b);
    in_RDI = pQVar2;
    break;
  case (iterator)0x24:
    ::QVariant::QVariant((QVariant *)in_RDI,10);
    break;
  case (iterator)0x25:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (iterator)0x26:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (iterator)0x27:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x28:
    local_30 = 0x20;
    local_2c = 0x1010000;
    args._M_len = (size_type)&local_30;
    args._M_array = (iterator)(ulong)in_ESI;
    QList<Qt::Key>::QList((QList<Qt::Key> *)in_RDI,args);
    ::QVariant::fromValue<QList<Qt::Key>,_true>((QList<Qt::Key> *)in_RDI);
    QList<Qt::Key>::~QList((QList<Qt::Key> *)0x3ef405);
    break;
  case (iterator)0x29:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x2a:
    ::QVariant::QVariant((QVariant *)in_RDI,0xf);
    break;
  case (iterator)0x2b:
    ::QVariant::QVariant((QVariant *)in_RDI,0x9c4);
    break;
  case (iterator)0x2c:
    ::QVariant::QVariant((QVariant *)in_RDI,0x5dc);
    break;
  case (iterator)0x2d:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x2e:
    pQVar2 = in_RDI;
    QString::QString((QString *)0x3ef472);
    ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_e8);
    QString::~QString((QString *)0x3ef48b);
    in_RDI = pQVar2;
    break;
  case (iterator)0x2f:
    pQVar2 = in_RDI;
    QSize::QSize(in_RDI,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    ::QVariant::QVariant((QVariant *)in_RDI,local_f0);
    in_RDI = pQVar2;
    break;
  case (iterator)0x30:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (iterator)0x31:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (iterator)0x32:
    ::QVariant::QVariant((QVariant *)in_RDI,false);
    break;
  case (iterator)0x33:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  default:
    ::QVariant::QVariant((QVariant *)0x3ef4fa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QPlatformTheme::defaultThemeHint(ThemeHint hint)
{
    switch (hint) {
    case QPlatformTheme::CursorFlashTime:
        return QVariant(1000);
    case QPlatformTheme::KeyboardInputInterval:
        return QVariant(400);
    case QPlatformTheme::KeyboardAutoRepeatRate:
        return QVariant(30);
    case QPlatformTheme::MouseDoubleClickInterval:
        return QVariant(400);
    case QPlatformTheme::StartDragDistance:
        return QVariant(10);
    case QPlatformTheme::StartDragTime:
        return QVariant(500);
    case QPlatformTheme::PasswordMaskDelay:
        return QVariant(int(0));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(u'\x25CF'));
    case QPlatformTheme::StartDragVelocity:
        return QVariant(int(0)); // no limit
    case QPlatformTheme::UseFullScreenForPopupMenu:
        return QVariant(false);
    case QPlatformTheme::WindowAutoPlacement:
        return QVariant(false);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(int(0));
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(false);
    case QPlatformTheme::ItemViewActivateItemOnSingleClick:
        return QVariant(false);
    case QPlatformTheme::ToolButtonStyle:
        return QVariant(int(Qt::ToolButtonIconOnly));
    case QPlatformTheme::ToolBarIconSize:
        return QVariant(int(0));
    case QPlatformTheme::SystemIconThemeName:
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString());
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::IconFallbackSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::StyleNames:
        return QVariant(QStringList());
    case QPlatformTheme::ShowShortcutsInContextMenus:
        return QVariant(true);
    case TextCursorWidth:
        return QVariant(1);
    case DropShadow:
        return QVariant(false);
    case MaximumScrollBarDragDistance:
        return QVariant(-1);
    case KeyboardScheme:
        return QVariant(int(WindowsKeyboardScheme));
    case UiEffects:
        return QVariant(int(0));
    case SpellCheckUnderlineStyle:
        return QVariant(int(QTextCharFormat::WaveUnderline));
    case TabFocusBehavior:
        return QVariant(int(Qt::TabFocusAllControls));
    case IconPixmapSizes:
        return QVariant::fromValue(QList<int>());
    case DialogSnapToDefaultButton:
    case ContextMenuOnMouseRelease:
        return QVariant(false);
    case MousePressAndHoldInterval:
        return QVariant(800);
    case MouseDoubleClickDistance:
        {
            bool ok = false;
            const int dist = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST", &ok);
            return QVariant(ok ? dist : 5);
        }
    case WheelScrollLines:
        return QVariant(3);
    case TouchDoubleTapDistance:
        {
            bool ok = false;
            int dist = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST", &ok);
            if (!ok)
                dist = defaultThemeHint(MouseDoubleClickDistance).toInt(&ok) * 2;
            return QVariant(ok ? dist : 10);
        }
    case MouseQuickSelectionThreshold:
        return QVariant(10);
    case InteractiveResizeAcrossScreens:
        return true;
    case ShowDirectoriesFirst:
        return true;
    case PreselectFirstFileInDirectory:
        return false;
    case ButtonPressKeys:
        return QVariant::fromValue(QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Select }));
    case SetFocusOnTouchRelease:
        return false;
    case FlickStartDistance:
        return QVariant(15);
    case FlickMaximumVelocity:
        return QVariant(2500);
    case FlickDeceleration:
        return QVariant(1500);
    case MenuBarFocusOnAltPressRelease:
        return false;
    case MouseCursorTheme:
        return QVariant(QString());
    case MouseCursorSize:
        return QVariant(QSize(16, 16));
    case UnderlineShortcut:
        return true;
    case ShowIconsInMenus:
        return true;
    case PreferFileIconFromTheme:
        return false;
    case MenuSelectionWraps:
        return true;
    }

    return QVariant();
}